

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::InsertEdge
          (GraphCycles *this,GraphId idx,GraphId idy)

{
  Rep *rep;
  bool bVar1;
  int32_t v;
  int32_t v_00;
  Node *pNVar2;
  Node *pNVar3;
  int *piVar4;
  Node **ppNVar5;
  int *d;
  int *__end3;
  int *__begin3;
  Vec<int> *__range3;
  Node *ny;
  Node *nx;
  int32_t y;
  int32_t x;
  Rep *r;
  GraphCycles *this_local;
  GraphId idy_local;
  GraphId idx_local;
  
  rep = this->rep_;
  v = synchronization_internal::anon_unknown_0::NodeIndex(idx);
  v_00 = synchronization_internal::anon_unknown_0::NodeIndex(idy);
  pNVar2 = FindNode(rep,idx);
  pNVar3 = FindNode(rep,idy);
  if ((pNVar2 == (Node *)0x0) || (pNVar3 == (Node *)0x0)) {
    idx_local.handle._7_1_ = true;
  }
  else if (pNVar2 == pNVar3) {
    idx_local.handle._7_1_ = false;
  }
  else {
    bVar1 = synchronization_internal::anon_unknown_0::NodeSet::insert(&pNVar2->out,v_00);
    if (bVar1) {
      synchronization_internal::anon_unknown_0::NodeSet::insert(&pNVar3->in,v);
      if (pNVar3->rank < pNVar2->rank) {
        bVar1 = ForwardDFS(rep,v_00,pNVar2->rank);
        if (bVar1) {
          BackwardDFS(rep,v,pNVar3->rank);
          Reorder(rep);
          idx_local.handle._7_1_ = true;
        }
        else {
          synchronization_internal::anon_unknown_0::NodeSet::erase(&pNVar2->out,v_00);
          synchronization_internal::anon_unknown_0::NodeSet::erase(&pNVar3->in,v);
          __end3 = synchronization_internal::anon_unknown_0::Vec<int>::begin(&rep->deltaf_);
          piVar4 = synchronization_internal::anon_unknown_0::Vec<int>::end(&rep->deltaf_);
          for (; __end3 != piVar4; __end3 = __end3 + 1) {
            ppNVar5 = synchronization_internal::anon_unknown_0::
                      Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
                      ::operator[](&rep->nodes_,*__end3);
            (*ppNVar5)->visited = false;
          }
          idx_local.handle._7_1_ = false;
        }
      }
      else {
        idx_local.handle._7_1_ = true;
      }
    }
    else {
      idx_local.handle._7_1_ = true;
    }
  }
  return idx_local.handle._7_1_;
}

Assistant:

bool GraphCycles::InsertEdge(GraphId idx, GraphId idy) {
  Rep* r = rep_;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);
  Node* nx = FindNode(r, idx);
  Node* ny = FindNode(r, idy);
  if (nx == nullptr || ny == nullptr) return true;  // Expired ids

  if (nx == ny) return false;  // Self edge
  if (!nx->out.insert(y)) {
    // Edge already exists.
    return true;
  }

  ny->in.insert(x);

  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx->out.erase(y);
    ny->in.erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    for (const auto& d : r->deltaf_) {
      r->nodes_[static_cast<uint32_t>(d)]->visited = false;
    }
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}